

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

TryEmplaceResult * __thiscall
QHash<QString,QString>::tryEmplace_impl<QString_const&>
          (TryEmplaceResult *__return_storage_ptr__,QHash<QString,QString> *this,QString *key)

{
  uchar uVar1;
  uint *puVar2;
  Span *pSVar3;
  Data *pDVar4;
  Data<QHashPrivate::Node<QString,_QString>_> *pDVar5;
  size_t hash;
  Node<QString,_QString> *pNVar7;
  long in_FS_OFFSET;
  bool bVar9;
  QStringView QVar10;
  Bucket BVar11;
  QHash<QString,_QString> local_40;
  long local_38;
  Span *pSVar6;
  ulong uVar8;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)this == 0) {
    pDVar5 = QHashPrivate::Data<QHashPrivate::Node<QString,_QString>_>::detached
                       ((Data<QHashPrivate::Node<QString,_QString>_> *)0x0);
    *(Data<QHashPrivate::Node<QString,_QString>_> **)this = pDVar5;
  }
  local_40.d = (Data *)0x0;
  pDVar5 = *(Data<QHashPrivate::Node<QString,_QString>_> **)this;
  QVar10.m_data = (key->d).ptr;
  QVar10.m_size = (key->d).size;
  hash = qHash(QVar10,pDVar5->seed);
  BVar11 = QHashPrivate::Data<QHashPrivate::Node<QString,_QString>_>::findBucketWithHash<QString>
                     (pDVar5,key,hash);
  uVar8 = BVar11.index;
  pSVar6 = BVar11.span;
  uVar1 = pSVar6->offsets[uVar8];
  puVar2 = *(uint **)this;
  if ((puVar2 == (uint *)0x0) || (1 < *puVar2)) {
LAB_00136dea:
    QHash<QString,_QString>::operator=(&local_40,(QHash<QString,_QString> *)this);
    if (uVar1 == 0xff) {
      bVar9 = *(ulong *)(*(long *)this + 0x10) >> 1 <= *(ulong *)(*(long *)this + 8);
    }
    else {
      bVar9 = false;
    }
    pDVar5 = *(Data<QHashPrivate::Node<QString,_QString>_> **)this;
    pSVar3 = pDVar5->spans;
    if (bVar9) {
      pDVar5 = QHashPrivate::Data<QHashPrivate::Node<QString,_QString>_>::detached
                         (pDVar5,pDVar5->size + 1);
    }
    else {
      pDVar5 = QHashPrivate::Data<QHashPrivate::Node<QString,_QString>_>::detached(pDVar5);
    }
    *(Data<QHashPrivate::Node<QString,_QString>_> **)this = pDVar5;
    if (bVar9) {
      BVar11 = QHashPrivate::Data<QHashPrivate::Node<QString,_QString>_>::
               findBucketWithHash<QString>(pDVar5,key,hash);
    }
    else {
      BVar11.index._0_4_ = (uint)BVar11.index & 0x7f;
      BVar11.span = pDVar5->spans +
                    ((((ulong)((long)pSVar6 - (long)pSVar3) >> 4) * 0x1c71c71c71c71c80 | uVar8) >> 7
                    );
      BVar11.index._4_4_ = 0;
    }
  }
  else {
    if (uVar1 != 0xff) goto LAB_00136ee6;
    if (*(ulong *)(puVar2 + 4) >> 1 <= *(ulong *)(puVar2 + 2)) goto LAB_00136dea;
  }
  if (uVar1 == 0xff) {
    pNVar7 = QHashPrivate::Span<QHashPrivate::Node<QString,_QString>_>::insert
                       (BVar11.span,BVar11.index);
    pDVar4 = (key->d).d;
    (pNVar7->key).d.d = pDVar4;
    (pNVar7->key).d.ptr = (key->d).ptr;
    (pNVar7->key).d.size = (key->d).size;
    if (pDVar4 != (Data *)0x0) {
      LOCK();
      (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    (pNVar7->value).d.d = (Data *)0x0;
    (pNVar7->value).d.ptr = (char16_t *)0x0;
    (pNVar7->value).d.size = 0;
    *(long *)(*(long *)this + 8) = *(long *)(*(long *)this + 8) + 1;
  }
LAB_00136ee6:
  pSVar6 = (*(Data<QHashPrivate::Node<QString,_QString>_> **)this)->spans;
  (__return_storage_ptr__->iterator).i.d = *(Data<QHashPrivate::Node<QString,_QString>_> **)this;
  (__return_storage_ptr__->iterator).i.bucket =
       ((ulong)((long)BVar11.span - (long)pSVar6) >> 4) * 0x1c71c71c71c71c80 | BVar11.index;
  __return_storage_ptr__->inserted = uVar1 == 0xff;
  QHash<QString,_QString>::~QHash(&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

TryEmplaceResult tryEmplace_impl(K &&key, Args &&...args)
    {
        if (!d)
            detach();
        QHash detachGuard;

        size_t hash = QHashPrivate::calculateHash(key, d->seed);
        typename Data::Bucket bucket = d->findBucketWithHash(key, hash);
        const bool shouldInsert = bucket.isUnused();

        // Even if we don't insert we may have to detach because we are
        // returning a non-const iterator:
        if (!isDetached() || (shouldInsert && d->shouldGrow())) {
            detachGuard = *this;
            const bool resized = shouldInsert && d->shouldGrow();
            const size_t bucketIndex = bucket.toBucketIndex(d);

            // Must detach from detachGuard
            d = resized ? Data::detached(d, d->size + 1) : Data::detached(d);
            bucket = resized ? d->findBucketWithHash(key, hash) : typename Data::Bucket(d, bucketIndex);
        }
        if (shouldInsert) {
            Node *n = bucket.insert();
            using ConstructProxy = typename QHashPrivate::HeterogenousConstructProxy<Key, K>;
            Node::createInPlace(n, ConstructProxy(std::forward<K>(key)),
                                std::forward<Args>(args)...);
            ++d->size;
        }
        return {iterator(bucket.toIterator(d)), shouldInsert};
    }